

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::read_from_stream
          (mipmapped_texture *this,data_stream_serializer *serializer,format file_format)

{
  bool bVar1;
  undefined1 *other;
  char *pcVar2;
  char *pFilename;
  
  clear(this);
  if (serializer->m_pStream == (data_stream *)0x0) {
    pcVar2 = "Invalid stream";
LAB_00134c5c:
    dynamic_string::set(&this->m_last_error,pcVar2,0xffffffff);
    return false;
  }
  if (file_format == cFormatInvalid) {
    pcVar2 = (serializer->m_pStream->m_name).m_pStr;
    pFilename = "";
    if (pcVar2 != (char *)0x0) {
      pFilename = pcVar2;
    }
    file_format = texture_file_types::determine_file_format(pFilename);
    if (file_format == cFormatInvalid) {
      pcVar2 = "Unsupported file format";
      goto LAB_00134c5c;
    }
  }
  dynamic_string::set(&this->m_last_error,"Image file load failed",0xffffffff);
  bVar1 = texture_file_types::supports_mipmaps(file_format);
  if (bVar1) {
    if (file_format == cFormatKTX) {
      bVar1 = read_ktx(this,serializer);
    }
    else {
      if (file_format != cFormatCRN) {
        if (file_format != cFormatDDS) {
          return false;
        }
        bVar1 = read_dds_internal(this,serializer);
        if (!bVar1) {
          clear(this);
          return false;
        }
        goto LAB_00134c7a;
      }
      bVar1 = read_crn(this,serializer);
    }
  }
  else {
    bVar1 = read_regular_image(this,serializer);
  }
  if (bVar1 == false) {
    return false;
  }
LAB_00134c7a:
  this->m_source_file_type = file_format;
  if (serializer->m_pStream == (data_stream *)0x0) {
    other = g_empty_dynamic_string;
  }
  else {
    other = (undefined1 *)&serializer->m_pStream->m_name;
  }
  dynamic_string::set(&this->m_name,(dynamic_string *)other,0xffffffff);
  dynamic_string::clear(&this->m_last_error);
  return true;
}

Assistant:

bool mipmapped_texture::read_from_stream(data_stream_serializer& serializer, texture_file_types::format file_format) {
  clear();

  if (!serializer.get_stream()) {
    set_last_error("Invalid stream");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(serializer.get_name().get_ptr());

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unsupported file format");
    return false;
  }

  set_last_error("Image file load failed");

  bool success = false;

  if (!texture_file_types::supports_mipmaps(file_format)) {
    success = read_regular_image(serializer);
  } else {
    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = read_dds(serializer);
        break;
      }
      case texture_file_types::cFormatCRN: {
        success = read_crn(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = read_ktx(serializer);
        break;
      }
      default: {
        CRNLIB_ASSERT(0);
        break;
      }
    }
  }

  if (success) {
    CRNLIB_ASSERT(check());

    m_source_file_type = file_format;
    set_name(serializer.get_name());
    clear_last_error();
  }

  return success;
}